

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

bool __thiscall FIX::Session::nextQueued(Session *this,int num,UtcTimeStamp *timeStamp)

{
  bool bVar1;
  FieldMap *this_00;
  signed_int value;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1e0 [8];
  MsgType msgType;
  Message msg;
  UtcTimeStamp *timeStamp_local;
  int num_local;
  Session *this_local;
  
  Message::Message((Message *)&msgType.super_StringField.super_FieldBase.m_metrics.m_checksum);
  MsgType::MsgType((MsgType *)local_1e0);
  bVar1 = SessionState::retrieve
                    (&this->m_state,num,
                     (Message *)&msgType.super_StringField.super_FieldBase.m_metrics.m_checksum);
  if (!bVar1) {
    this_local._7_1_ = false;
    goto LAB_0028aebe;
  }
  IntConvertor::convert_abi_cxx11_(&local_230,(IntConvertor *)(ulong)(uint)num,value);
  std::operator+(&local_210,"Processing QUEUED message: ",&local_230);
  SessionState::onEvent(&this->m_state,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  this_00 = &Message::getHeader((Message *)
                                &msgType.super_StringField.super_FieldBase.m_metrics.m_checksum)->
             super_FieldMap;
  FieldMap::getField(this_00,(FieldBase *)local_1e0);
  bVar1 = FIX::operator==((StringField *)local_1e0,"A");
  if (bVar1) {
LAB_0028adf8:
    SessionState::incrNextTargetMsgSeqNum(&this->m_state);
  }
  else {
    bVar1 = FIX::operator==((StringField *)local_1e0,"2");
    if (bVar1) goto LAB_0028adf8;
    next(this,(Message *)&msgType.super_StringField.super_FieldBase.m_metrics.m_checksum,timeStamp,
         true);
  }
  this_local._7_1_ = true;
LAB_0028aebe:
  MsgType::~MsgType((MsgType *)local_1e0);
  Message::~Message((Message *)&msgType.super_StringField.super_FieldBase.m_metrics.m_checksum);
  return this_local._7_1_;
}

Assistant:

bool Session::nextQueued( int num, const UtcTimeStamp& timeStamp )
{
  Message msg;
  MsgType msgType;

  if( m_state.retrieve( num, msg ) )
  {
    m_state.onEvent( "Processing QUEUED message: "
                     + IntConvertor::convert( num ) );
    msg.getHeader().getField( msgType );
    if( msgType == MsgType_Logon
        || msgType == MsgType_ResendRequest )
    {
      m_state.incrNextTargetMsgSeqNum();
    }
    else
    {
      next( msg, timeStamp, true );
    }
    return true;
  }
  return false;
}